

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O0

App * __thiscall CLI::App::add_subcommand(App *this,string *name,string *description)

{
  bool bVar1;
  App *this_00;
  reference pvVar2;
  pointer pAVar3;
  pointer pAVar4;
  OptionAlreadyAdded *this_01;
  bool local_131;
  string local_e0;
  byte local_b9;
  string local_b8;
  string local_98;
  reference local_78;
  unique_ptr<CLI::App,_std::default_delete<CLI::App>_> *subc;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
  *__range2;
  string local_48;
  App *local_28;
  string *local_20;
  string *description_local;
  string *name_local;
  App *this_local;
  
  local_20 = description;
  description_local = name;
  name_local = (string *)this;
  this_00 = (App *)operator_new(0x1d0);
  ::std::__cxx11::string::string((string *)&local_48,(string *)description);
  App(this_00,&local_48,this);
  local_28 = this_00;
  ::std::
  vector<std::unique_ptr<CLI::App,std::default_delete<CLI::App>>,std::allocator<std::unique_ptr<CLI::App,std::default_delete<CLI::App>>>>
  ::emplace_back<CLI::App*>
            ((vector<std::unique_ptr<CLI::App,std::default_delete<CLI::App>>,std::allocator<std::unique_ptr<CLI::App,std::default_delete<CLI::App>>>>
              *)&this->subcommands_,&local_28);
  ::std::__cxx11::string::~string((string *)&local_48);
  pvVar2 = std::
           vector<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
           ::back(&this->subcommands_);
  pAVar3 = std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>::operator->(pvVar2);
  ::std::__cxx11::string::operator=((string *)&pAVar3->name_,(string *)name);
  __end2 = std::
           vector<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
           ::begin(&this->subcommands_);
  subc = (unique_ptr<CLI::App,_std::default_delete<CLI::App>_> *)
         std::
         vector<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
         ::end(&this->subcommands_);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_*,_std::vector<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>_>
                                *)&subc);
    if (!bVar1) {
      pvVar2 = std::
               vector<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
               ::back(&this->subcommands_);
      pAVar3 = std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>::get(pvVar2);
      return pAVar3;
    }
    local_78 = __gnu_cxx::
               __normal_iterator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_*,_std::vector<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>_>
               ::operator*(&__end2);
    pAVar3 = std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>::get(local_78);
    pvVar2 = std::
             vector<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
             ::back(&this->subcommands_);
    pAVar4 = std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>::get(pvVar2);
    if (pAVar3 != pAVar4) {
      pAVar3 = std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>::operator->(local_78);
      pvVar2 = std::
               vector<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
               ::back(&this->subcommands_);
      pAVar4 = std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>::operator->(pvVar2);
      ::std::__cxx11::string::string((string *)&local_98,(string *)&pAVar4->name_);
      local_b9 = 0;
      bVar1 = check_name(pAVar3,&local_98);
      local_131 = true;
      if (!bVar1) {
        pvVar2 = std::
                 vector<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
                 ::back(&this->subcommands_);
        pAVar3 = std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>::operator->(pvVar2);
        pAVar4 = std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>::operator->(local_78);
        ::std::__cxx11::string::string((string *)&local_b8,(string *)&pAVar4->name_);
        local_b9 = 1;
        local_131 = check_name(pAVar3,&local_b8);
      }
      if ((local_b9 & 1) != 0) {
        ::std::__cxx11::string::~string((string *)&local_b8);
      }
      ::std::__cxx11::string::~string((string *)&local_98);
      if (local_131 != false) {
        this_01 = (OptionAlreadyAdded *)__cxa_allocate_exception(0x38);
        pAVar3 = std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>::operator->(local_78);
        ::std::__cxx11::string::string((string *)&local_e0,(string *)&pAVar3->name_);
        OptionAlreadyAdded::OptionAlreadyAdded(this_01,&local_e0);
        __cxa_throw(this_01,&OptionAlreadyAdded::typeinfo,OptionAlreadyAdded::~OptionAlreadyAdded);
      }
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_*,_std::vector<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

App *add_subcommand(std::string name, std::string description = "") {
        subcommands_.emplace_back(new App(description, this));
        subcommands_.back()->name_ = name;
        for(const auto &subc : subcommands_)
            if(subc.get() != subcommands_.back().get())
                if(subc->check_name(subcommands_.back()->name_) || subcommands_.back()->check_name(subc->name_))
                    throw OptionAlreadyAdded(subc->name_);
        return subcommands_.back().get();
    }